

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

void __thiscall Screen_Manager::Block(Screen_Manager *this,timeval *timeout)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  fd_set *pfVar4;
  __fd_mask *p_Var5;
  timeval multiDisplayTimeout;
  fd_set read_Fd_Select;
  timeval local_a0;
  fd_set local_90;
  
  if ((timeout == (timeval *)0x0) && (More_Than_One_Display)) {
    timeout = (timeval *)&local_a0;
    local_a0.tv_sec = 0;
    local_a0.tv_usec = 100;
  }
  lVar3 = 0x10;
  pfVar4 = &this->read_flag;
  p_Var5 = local_90.fds_bits;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    *p_Var5 = pfVar4->fds_bits[0];
    pfVar4 = (fd_set *)(pfVar4->fds_bits + 1);
    p_Var5 = p_Var5 + 1;
  }
  if (Am_Connection::num_sockets == 0) {
    iVar2 = this->nfds;
  }
  else {
    iVar2 = Am_Connection::Merge_Mask(&local_90);
    if (iVar2 < this->nfds) {
      iVar2 = this->nfds;
    }
  }
  iVar2 = select(iVar2,(fd_set *)&local_90,(fd_set *)0x0,(fd_set *)0x0,(timeval *)timeout);
  if (iVar2 < 0) {
    perror("Am_Error in Block");
  }
  bVar1 = Am_Connection::Sockets_Have_Input(&local_90);
  if (bVar1) {
    Am_Connection::Handle_Sockets(&local_90);
  }
  return;
}

Assistant:

void
Screen_Manager::Block(timeval *timeout)
{
  //
  // Right now there is no way to wait on several displays at once. To do
  // that we would have to implement a separate thread for each display.
  //
  // So if the caller did not specify a timeout then we will end up
  // blocking on the first display even if there are events waiting on
  // other displays.
  //
  // To get around this, if there are multiple displays then we force a
  // small timeout. This gives us proper operation in applications which
  // only use a single display and a busy-wait-loop in applications which
  // use multiple displays.
  //
  timeval multiDisplayTimeout;

  if (More_Than_One_Display && (timeout == nullptr)) {
    multiDisplayTimeout.tv_sec = 0;
    multiDisplayTimeout.tv_usec = 100;
    timeout = &multiDisplayTimeout;
  }

  int status;
  // We only want to block until we time out.  If we have no event
  // by then, oh well, just exit anyway.

  // read_Fd_Select is destructively modified by select() so save a copy
  fd_set read_Fd_Select = read_flag;

  ////////////////////////////////////////////////////////////////
  // Networking hooks
  int new_nfds = 0;

  if (Am_Connection::Active()) {
    new_nfds = Am_Connection::Merge_Mask(&read_Fd_Select);
    if (nfds > new_nfds)
      new_nfds = nfds;
  } else // No open connections
  {
    new_nfds = nfds;
  }

  // Return from Networking Hooks
  //////////////////////////////////////////////////////////////
  status = select(new_nfds, &read_Fd_Select, nullptr, nullptr, timeout);
  if (status < 0)
    perror("Am_Error in Block");

  //////////////////////////////////////////////////////////////
  // One last Networking hook

  if (Am_Connection::Sockets_Have_Input(&read_Fd_Select))
    Am_Connection::Handle_Sockets(&read_Fd_Select);

  // End of Networking hooks.
  /////////////////////////////////////////////////////////////
}